

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGL3DriverBase::updateVertexHardwareBuffer
          (COpenGL3DriverBase *this,SHWBufferLink_opengl *HWBuffer)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  E_VERTEX_TYPE vertexType;
  u32 uVar4;
  uint uVar5;
  void *pvVar6;
  long in_RSI;
  COpenGL3DriverBase *in_RDI;
  GLenum usage;
  bool newBuffer;
  size_t bufferSize;
  void *buffer;
  u32 vertexSize;
  E_VERTEX_TYPE vType;
  u32 vertexCount;
  void *vertices;
  IMeshBuffer *mb;
  GLenum local_50;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    plVar1 = *(long **)(in_RSI + 8);
    pvVar6 = (void *)(**(code **)(*plVar1 + 0x18))();
    iVar3 = (**(code **)(*plVar1 + 0x28))();
    vertexType = (**(code **)(*plVar1 + 0x10))();
    uVar4 = getVertexPitchFromType(vertexType);
    uVar5 = uVar4 * iVar3;
    if (*(int *)(in_RSI + 0x28) == 0) {
      (*GL.GenBuffers)(1,(GLuint *)(in_RSI + 0x28));
      if (*(int *)(in_RSI + 0x28) == 0) {
        return false;
      }
      bVar2 = true;
    }
    else {
      bVar2 = *(uint *)(in_RSI + 0x30) < uVar5;
    }
    (*GL.BindBuffer)(0x8892,*(GLuint *)(in_RSI + 0x28));
    if (bVar2) {
      *(uint *)(in_RSI + 0x30) = uVar5;
      local_50 = 0x88e4;
      if (*(int *)(in_RSI + 0x1c) == 3) {
        local_50 = 0x88e0;
      }
      else if (*(int *)(in_RSI + 0x1c) == 2) {
        local_50 = 0x88e8;
      }
      (*GL.BufferData)(0x8892,(GLsizeiptr)uVar5,pvVar6,local_50);
    }
    else {
      (*GL.BufferSubData)(0x8892,0,(GLsizeiptr)uVar5,pvVar6);
    }
    (*GL.BindBuffer)(0x8892,0);
    bVar2 = testGLError(in_RDI,0x206);
    local_1 = (bool)((bVar2 ^ 0xffU) & 1);
  }
  return local_1;
}

Assistant:

bool COpenGL3DriverBase::updateVertexHardwareBuffer(SHWBufferLink_opengl *HWBuffer)
{
	if (!HWBuffer)
		return false;

	const scene::IMeshBuffer *mb = HWBuffer->MeshBuffer;
	const void *vertices = mb->getVertices();
	const u32 vertexCount = mb->getVertexCount();
	const E_VERTEX_TYPE vType = mb->getVertexType();
	const u32 vertexSize = getVertexPitchFromType(vType);

	const void *buffer = vertices;
	size_t bufferSize = vertexSize * vertexCount;

	// get or create buffer
	bool newBuffer = false;
	if (!HWBuffer->vbo_verticesID) {
		GL.GenBuffers(1, &HWBuffer->vbo_verticesID);
		if (!HWBuffer->vbo_verticesID)
			return false;
		newBuffer = true;
	} else if (HWBuffer->vbo_verticesSize < bufferSize) {
		newBuffer = true;
	}

	GL.BindBuffer(GL_ARRAY_BUFFER, HWBuffer->vbo_verticesID);

	// copy data to graphics card
	if (!newBuffer)
		GL.BufferSubData(GL_ARRAY_BUFFER, 0, bufferSize, buffer);
	else {
		HWBuffer->vbo_verticesSize = bufferSize;

		GLenum usage = GL_STATIC_DRAW;
		if (HWBuffer->Mapped_Index == scene::EHM_STREAM)
			usage = GL_STREAM_DRAW;
		else if (HWBuffer->Mapped_Index == scene::EHM_DYNAMIC)
			usage = GL_DYNAMIC_DRAW;
		GL.BufferData(GL_ARRAY_BUFFER, bufferSize, buffer, usage);
	}

	GL.BindBuffer(GL_ARRAY_BUFFER, 0);

	return (!testGLError(__LINE__));
}